

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.c
# Opt level: O0

size_t coda_base58_encode_alloc(char *in,size_t inlen,char **out)

{
  long lVar1;
  void *pvVar2;
  long *in_RDX;
  size_t in_RSI;
  char *in_RDI;
  bool bVar3;
  size_t outlen;
  size_t nonzero_inlen;
  size_t zeroes;
  size_t local_30;
  size_t outlen_00;
  size_t local_8;
  
  outlen_00 = 0;
  local_30 = in_RSI;
  while( true ) {
    bVar3 = false;
    if (local_30 != 0) {
      bVar3 = in_RDI[outlen_00] == '\0';
    }
    if (!bVar3) break;
    outlen_00 = outlen_00 + 1;
    local_30 = local_30 - 1;
  }
  lVar1 = outlen_00 + (local_30 * 0x8a) / 100;
  local_8 = lVar1 + 2;
  pvVar2 = malloc(local_8);
  *in_RDX = (long)pvVar2;
  if (*in_RDX != 0) {
    coda_base58_encode(in_RDI,in_RSI,(char *)in_RDX,outlen_00);
    local_8 = lVar1 + 1;
  }
  return local_8;
}

Assistant:

size_t coda_base58_encode_alloc (const char *in, size_t inlen, char **out)
{
    size_t zeroes = 0;
    size_t nonzero_inlen = inlen;
    while (nonzero_inlen && !in[zeroes])
    {
        zeroes++;
        nonzero_inlen--;
    }

    size_t outlen = zeroes + nonzero_inlen * 138 / 100 + 2;

    *out = malloc (outlen);
    if (!*out)
        return outlen;

    coda_base58_encode (in, inlen, *out, outlen);
    return outlen - 1;
}